

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splayTest.cpp
# Opt level: O2

void testConfigurationCorrectness(int dataCount,int minimumN)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  vector<double,_std::allocator<double>_> aF;
  vector<double,_std::allocator<double>_> aL;
  vector<double,_std::allocator<double>_> aJ;
  double local_1a8;
  double local_198;
  _Vector_base<double,_std::allocator<double>_> local_190;
  _Vector_base<double,_std::allocator<double>_> local_178;
  _Vector_base<double,_std::allocator<double>_> local_160;
  double local_148;
  double local_138;
  SplayWeightConfiguration local_128;
  
  randomVector((vector<double,_std::allocator<double>_> *)&local_160,mJ + 1);
  randomVector((vector<double,_std::allocator<double>_> *)&local_178,mL + 1);
  randomVector((vector<double,_std::allocator<double>_> *)&local_190,mF + 1);
  SplayWeightConfiguration::SplayWeightConfiguration
            (&local_128,(vector<double,_std::allocator<double>_> *)&local_160,
             (vector<double,_std::allocator<double>_> *)&local_178,
             (vector<double,_std::allocator<double>_> *)&local_190);
  std::chrono::_V2::system_clock::now();
  iVar5 = 0;
  if (0 < dataCount) {
    iVar5 = dataCount;
  }
  local_198 = 0.0;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    uVar1 = rand();
    iVar3 = local_128.n;
    if ((uVar1 & 1) == 0) {
      if (minimumN < local_128.n) {
        iVar2 = rand();
        iVar2 = iVar2 % iVar3;
        dVar7 = SplayWeightConfiguration::removeDeltaWeightJL
                          (&local_128,
                           local_128.c.
                           super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar2].first,
                           local_128.c.
                           super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar2].second);
        dVar8 = SplayWeightConfiguration::removeDeltaWeightF(&local_128);
        local_128.weightJL = dVar7 + local_128.weightJL;
        local_128.weightF = dVar8 + local_128.weightF;
        SplayWeightConfiguration::removeSpin(&local_128,iVar2);
      }
    }
    else {
      iVar3 = rand();
      dVar7 = generateDataPoint();
      bVar6 = (bool)((byte)iVar3 & 1);
      local_138 = SplayWeightConfiguration::insertDeltaWeightJL(&local_128,bVar6,dVar7);
      local_148 = SplayWeightConfiguration::insertDeltaWeightF(&local_128);
      SplayWeightConfiguration::insertSpin(&local_128,bVar6,dVar7);
      local_128.weightJL = local_138 + local_128.weightJL;
      local_128.weightF = local_148 + local_128.weightF;
    }
    if (local_128.n == 0) {
      local_1a8 = local_128.weightF;
    }
    else {
      local_1a8 = local_128.weightJL / (double)local_128.n + local_128.weightF;
    }
    dVar7 = SplayWeightConfiguration::bruteForceMBH(&local_128);
    local_198 = local_198 + ABS((local_1a8 - dVar7) / dVar7);
  }
  std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"average error for m^2 configuration = ");
  poVar4 = std::ostream::_M_insert<double>(local_198 / (double)dataCount);
  std::endl<char,std::char_traits<char>>(poVar4);
  SplayWeightConfiguration::~SplayWeightConfiguration(&local_128);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_190);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_178);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_160);
  return;
}

Assistant:

void testConfigurationCorrectness(int dataCount = 10000, int minimumN = 30) {
    // run a test of dataCount steps, n cannot be decreased if lower than minimumN
    // test the correctness by comparing with O(n^2) weight calculation
    vector<double> aJ = randomVector(mJ + 1);
    vector<double> aL = randomVector(mL + 1);
    vector<double> aF = randomVector(mF + 1);
    bool efficiencyTest = false;
    SplayWeightConfiguration c(aJ, aL, aF);
    double dWeightJL, dWeightF;
    double totalError = 0.0;
    // int dataCount = 10000;
    double averageN = 0;

    auto millisecBeforeSimulation = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
    for (int i = 0; i < dataCount; ++i) {
        bool isInsert = randomInt(2);
        if (isInsert) {
            bool spin = randomInt(2);
            double tau = generateDataPoint();
            dWeightJL = c.insertDeltaWeightJL(spin, tau);
            dWeightF = c.insertDeltaWeightF();
            c.insertSpin(spin, tau);
            c.updateWeight(dWeightJL, dWeightF);
        } else if (c.n > minimumN) {
            int idx = randomInt(c.n);
            dWeightJL = c.removeDeltaWeightJL(c.c[idx].first, c.c[idx].second);
            dWeightF = c.removeDeltaWeightF();
            c.updateWeight(dWeightJL, dWeightF);
            c.removeSpin(idx);
        }
        if (!efficiencyTest) {
            double weight = c.getWeight(), mbhWeight = c.bruteForceMBH();
            totalError += fabs((weight - mbhWeight) / mbhWeight);
        }

        averageN += c.n;
    }
    auto millisecAfterSimulation = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
    averageN /= dataCount;
    if (efficiencyTest) {
        cout << "Test the efficiency for a simulation of " << dataCount << " steps." << endl;
        cout << (millisecAfterSimulation - millisecBeforeSimulation) * 1000000.0 / dataCount << " milliseconds for 10^6 steps, with average n = " << averageN << ", (mL, mJ, mF) = (" << mL << ", " << mJ << ", " << mF << ")." << endl;
    }
    if (!efficiencyTest) {
        double averageError = totalError / dataCount;
        cout << "average error for m^2 configuration = " << averageError << endl;
    }
    // c.printA();
}